

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O0

void cmp_C1(void)

{
  ubyte uVar1;
  byte local_a;
  uint flags;
  
  except = '\0';
  uVar1 = getbyte(pc);
  temp2 = uVar1 + x_reg;
  temp1 = getbyte((ushort)RAM[temp2] + (ushort)RAM[temp2 + 1 & 0xff] * 0x100);
  asm("push ax");
  asm("CLC");
  if (carry_f == '\0') {
    asm("STC");
  }
  _AL = acc;
  _AH = temp1;
  asm("cmp AL,AH");
  asm("pushf");
  asm("pop flags");
  asm("pop AX");
  carry_f = local_a & 1 ^ 1;
  result_f = local_a & 0xc0 ^ 0x40;
  pc = pc + 1;
  return;
}

Assistant:

void cmp_C1(void) {
    uint flags;
    CLE;
    temp2 = getbyte(pc) + x_reg;
    temp1 = getbyte(RAM[temp2] + 0x100 * RAM[(ubyte) (temp2 + 1)]);

    asm("push ax");

    asm("CLC");
    if (!carry_f) asm("STC");

    _AL = acc;
    _AH = temp1;

    asm("cmp AL,AH");
    asm("pushf");
    asm("pop flags");
    asm("pop AX");

    carry_f = (flags & 1) ^ 1;
    result_f = flags & 0xC0;
    result_f ^= 0x40;

    pc++;
}